

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8b1c::ARTKeyEncodeDecodeTest_C00001_Test::~ARTKeyEncodeDecodeTest_C00001_Test
          (ARTKeyEncodeDecodeTest_C00001_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, C00001) {
  unodb::key_encoder enc{};
  UNODB_EXPECT_EQ(enc.capacity(), INITIAL_CAPACITY);
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);
  // ensure some space is available w/o change in encoder.
  enc.ensure_available(INITIAL_CAPACITY - 1);  // edge case
  UNODB_EXPECT_EQ(enc.capacity(), INITIAL_CAPACITY);
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);
  // ensure some space is available w/o change in encoder.
  enc.ensure_available(INITIAL_CAPACITY);  // edge case
  UNODB_EXPECT_EQ(enc.capacity(), INITIAL_CAPACITY);
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);
  // reset -- nothing changes.
  enc.reset();
  UNODB_EXPECT_EQ(enc.capacity(), INITIAL_CAPACITY);
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);
  // key_view is empty
  const auto kv = enc.get_key_view();
  UNODB_EXPECT_EQ(kv.size_bytes(), 0);
}